

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileperblock_file.cpp
# Opt level: O0

void __thiscall
foxxll::fileperblock_file<foxxll::mmap_file>::lock(fileperblock_file<foxxll::mmap_file> *this)

{
  request_ptr offset;
  bool bVar1;
  ufs_file_base *puVar2;
  mmap_file *pmVar3;
  request *prVar4;
  counting_ptr<foxxll::mmap_file> *this_00;
  Delegate<void_(foxxll::request_*,_bool),_std::allocator<void>_> local_88;
  undefined1 local_60 [8];
  request_ptr r;
  void *one_page;
  int page_size;
  int local_3c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  CountingPtr<foxxll::mmap_file,_tlx::CountingPtrDefaultDeleter> local_18;
  fileperblock_file<foxxll::mmap_file> *local_10;
  fileperblock_file<foxxll::mmap_file> *this_local;
  
  local_10 = this;
  bVar1 = tlx::CountingPtr::operator_cast_to_bool((CountingPtr *)&this->lock_file_);
  if (!bVar1) {
    std::operator+(&local_38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &(this->super_disk_queued_file).field_0x10,"_fpb_lock");
    local_3c = (*(this->super_disk_queued_file)._vptr_disk_queued_file[2])();
    tlx::make_counting<foxxll::mmap_file,std::__cxx11::string,int&,int>
              ((tlx *)&local_18,&local_38,(int *)&(this->super_disk_queued_file).field_0x30,
               &local_3c);
    this_00 = &this->lock_file_;
    tlx::CountingPtr<foxxll::mmap_file,_tlx::CountingPtrDefaultDeleter>::operator=
              (this_00,&local_18);
    tlx::CountingPtr<foxxll::mmap_file,_tlx::CountingPtrDefaultDeleter>::~CountingPtr(&local_18);
    std::__cxx11::string::~string((string *)&local_38);
    r.ptr_ = (request *)aligned_alloc<4096ul>(0x1000,0);
    puVar2 = &tlx::CountingPtr<foxxll::mmap_file,_tlx::CountingPtrDefaultDeleter>::operator->
                        (this_00)->super_ufs_file_base;
    ufs_file_base::set_size(puVar2,0x1000);
    pmVar3 = tlx::CountingPtr<foxxll::mmap_file,_tlx::CountingPtrDefaultDeleter>::operator->
                       (this_00);
    offset = r;
    local_88.store_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_88.store_.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_88.caller_ = (Caller)0x0;
    local_88.object_ptr_ = (void *)0x0;
    tlx::Delegate<void_(foxxll::request_*,_bool),_std::allocator<void>_>::Delegate(&local_88);
    disk_queued_file::awrite
              ((disk_queued_file *)local_60,&(pmVar3->super_ufs_file_base).field_0x60,
               (offset_type)offset.ptr_,0,(completion_handler *)0x1000);
    tlx::Delegate<void_(foxxll::request_*,_bool),_std::allocator<void>_>::~Delegate(&local_88);
    prVar4 = tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::operator->
                       ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)local_60);
    (**(code **)(*(long *)(&prVar4->field_0x0 + *(long *)(*(long *)prVar4 + -0x68)) + 0x30))
              (&prVar4->field_0x0 + *(long *)(*(long *)prVar4 + -0x68),1);
    aligned_dealloc<4096ul>(r.ptr_);
    tlx::CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter>::~CountingPtr
              ((CountingPtr<foxxll::request,_tlx::CountingPtrDefaultDeleter> *)local_60);
  }
  puVar2 = &tlx::CountingPtr<foxxll::mmap_file,_tlx::CountingPtrDefaultDeleter>::operator->
                      (&this->lock_file_)->super_ufs_file_base;
  ufs_file_base::lock(puVar2);
  return;
}

Assistant:

void fileperblock_file<base_file_type>::lock()
{
    if (!lock_file_)
    {
        lock_file_ = tlx::make_counting<base_file_type>(
                filename_prefix_ + "_fpb_lock", mode_, get_queue_id()
            );

        //create lock file and fill it with one page, an empty file cannot be locked
        const int page_size = BlockAlignment;
        void* one_page = aligned_alloc<BlockAlignment>(page_size);
#if FOXXLL_WITH_VALGRIND
        memset(one_page, 0, page_size);
#endif
        lock_file_->set_size(page_size);
        request_ptr r = lock_file_->awrite(one_page, 0, page_size);
        r->wait();
        aligned_dealloc<BlockAlignment>(one_page);
    }
    lock_file_->lock();
}